

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestVC.cxx
# Opt level: O0

bool __thiscall cmCTestVC::WriteXML(cmCTestVC *this,cmXMLWriter *xml)

{
  int iVar1;
  bool result;
  cmXMLWriter *xml_local;
  cmCTestVC *this_local;
  
  std::operator<<(this->Log,"--- Begin Revisions ---\n");
  iVar1 = (*this->_vptr_cmCTestVC[6])(this,xml);
  std::operator<<(this->Log,"--- End Revisions ---\n");
  return (bool)((byte)iVar1 & 1);
}

Assistant:

bool cmCTestVC::WriteXML(cmXMLWriter& xml)
{
  this->Log << "--- Begin Revisions ---\n";
  bool result = this->WriteXMLUpdates(xml);
  this->Log << "--- End Revisions ---\n";
  return result;
}